

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

bool __thiscall i2p::sam::Session::Listen(Session *this,Connection *conn)

{
  long lVar1;
  _Head_base<0UL,_Sock_*,_false> _Var2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  undefined1 local_68 [32];
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock7,&this->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp",0x91
             ,false);
  CreateIfNotCreatedAlready(this);
  CService::operator=(&conn->me,&this->m_my_addr);
  StreamAccept((Session *)local_68);
  uVar3 = local_68._0_8_;
  local_68._0_8_ = (long *)0x0;
  _Var2._M_head_impl =
       (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
       super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
       super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl = (Sock *)uVar3;
  if (_Var2._M_head_impl != (Sock *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_Sock + 8))();
    if ((long *)local_68._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_68._0_8_ + 8))();
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool Session::Listen(Connection& conn)
{
    try {
        LOCK(m_mutex);
        CreateIfNotCreatedAlready();
        conn.me = m_my_addr;
        conn.sock = StreamAccept();
        return true;
    } catch (const std::runtime_error& e) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Error, "Couldn't listen: %s\n", e.what());
        CheckControlSock();
    }
    return false;
}